

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

optional<float> __thiscall wasm::WATParser::Lexer::takeF32(Lexer *this)

{
  pointer pAVar1;
  undefined8 uVar2;
  ulong uVar3;
  float fVar4;
  float extraout_XMM0_Da;
  string_view sVar5;
  undefined1 local_50 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult> result;
  
  sVar5 = next(this);
  anon_unknown_0::float_
            ((optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult> *)local_50,sVar5);
  if (result.
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>.
      _M_payload.
      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>.
      _M_payload._32_1_ == '\x01') {
    fVar4 = (float)(double)CONCAT71(result.
                                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>
                                    ._M_payload.
                                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>
                                    ._M_payload._25_7_,
                                    result.
                                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>
                                    ._M_payload.
                                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>
                                    ._M_payload._M_value.nanPayload.
                                    super__Optional_base<unsigned_long,_true,_true>._M_payload.
                                    super__Optional_payload_base<unsigned_long>._M_engaged);
    if (NAN(fVar4)) {
      uVar2 = 
      "llPrinterNS0_7VisitorIS5_vEEE4TaskESaIS9_EE12emplace_backIJRPFvPS5_PPNS0_10ExpressionEERSG_EEERS9_DpOT_"
      ;
      if (result.
          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>.
          _M_payload.
          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>.
          _M_payload._16_1_ != '\0') {
        uVar2 = result.
                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>
                ._M_payload.
                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>
                ._M_payload._M_value.super_LexResult.span._M_str;
      }
      if ((char *)0x7ffffe < (char *)(uVar2 + -1)) {
        uVar3 = 0;
        goto LAB_00b91911;
      }
      fVar4 = (float)((uint)uVar2 | (uint)fVar4 & 0xff800000);
    }
    this->pos = this->pos + (long)local_50;
    pAVar1 = (this->annotations).
             super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->annotations).
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_finish != pAVar1) {
      (this->annotations).
      super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
      _M_impl.super__Vector_impl_data._M_finish = pAVar1;
    }
    uVar3 = 0x100000000;
    result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>.
    _44_4_ = fVar4;
    skipSpace(this);
    goto LAB_00b91911;
  }
  sVar5 = next(this);
  anon_unknown_0::integer
            ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_50,sVar5);
  if (result.
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>.
      _M_payload.
      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>.
      _M_payload._M_value.nanPayload.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged != true) {
    uVar3 = 0;
    result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>.
    _44_4_ = extraout_XMM0_Da;
    goto LAB_00b91911;
  }
  this->pos = this->pos + (long)local_50;
  pAVar1 = (this->annotations).
           super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->annotations).
      super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
      _M_impl.super__Vector_impl_data._M_finish != pAVar1) {
    (this->annotations).
    super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
    _M_impl.super__Vector_impl_data._M_finish = pAVar1;
  }
  skipSpace(this);
  if (result.
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>.
      _M_payload.
      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>.
      _M_payload._16_4_ == 2) {
    if (result.
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>.
        _M_payload.
        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>.
        _M_payload._M_value.super_LexResult.span._M_str == (char *)0x0) {
      result.
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>.
      _M_payload.
      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>._44_4_ =
           -0.0;
    }
    else {
LAB_00b918eb:
      result.
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>.
      _M_payload.
      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>._44_4_ =
           (BADTYPE)(long)result.
                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>
                          ._M_payload._M_value.super_LexResult.span._M_str;
    }
  }
  else {
    if (-1 < (long)result.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>
                   ._M_payload._M_value.super_LexResult.span._M_str) goto LAB_00b918eb;
    result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>.
    _44_4_ = (BADTYPE)result.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>
                      ._M_payload._8_8_;
  }
  uVar3 = 0x100000000;
LAB_00b91911:
  return (optional<float>)
         ((uint)result.
                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>
                ._M_payload.
                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>
                ._44_4_ | uVar3);
}

Assistant:

std::optional<float> Lexer::takeF32() {
  constexpr int signif = 23;
  constexpr uint32_t payloadMask = (1u << signif) - 1;
  constexpr uint64_t nanDefault = 1ull << (signif - 1);
  if (auto result = float_(next())) {
    float f = result->d;
    if (std::isnan(f)) {
      // Validate and inject payload.
      uint64_t payload = result->nanPayload ? *result->nanPayload : nanDefault;
      if (payload == 0 || payload > payloadMask) {
        // TODO: Add error production for out-of-bounds payload.
        return std::nullopt;
      }
      uint32_t bits;
      static_assert(sizeof(bits) == sizeof(f));
      memcpy(&bits, &f, sizeof(bits));
      bits = (bits & ~payloadMask) | payload;
      memcpy(&f, &bits, sizeof(bits));
    }
    pos += result->span.size();
    advance();
    return f;
  }
  if (auto result = integer(next())) {
    pos += result->span.size();
    advance();
    if (result->sign == Neg) {
      if (result->n == 0) {
        return -0.0f;
      }
      return float(int64_t(result->n));
    }
    return float(result->n);
  }
  return std::nullopt;
}